

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O2

string * __thiscall
cmGeneratorExpressionEvaluationFile::GetOutputFileName
          (string *__return_storage_ptr__,cmGeneratorExpressionEvaluationFile *this,
          cmLocalGenerator *lg,cmGeneratorTarget *target,string *config,string *lang)

{
  bool bVar1;
  string *psVar2;
  string local_38;
  
  psVar2 = cmCompiledGeneratorExpression::Evaluate
                     ((this->OutputFileExpr)._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,lg
                      ,config,target,(cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0
                      ,lang);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  bVar1 = cmsys::SystemTools::FileIsFullPath(__return_storage_ptr__);
  if (bVar1) {
    cmsys::SystemTools::CollapseFullPath(&local_38,__return_storage_ptr__);
  }
  else {
    FixRelativePath(&local_38,this,__return_storage_ptr__,PathForOutput,lg);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionEvaluationFile::GetOutputFileName(
  cmLocalGenerator* lg, cmGeneratorTarget* target, const std::string& config,
  const std::string& lang)
{
  std::string outputFileName =
    this->OutputFileExpr->Evaluate(lg, config, target, nullptr, nullptr, lang);

  if (cmSystemTools::FileIsFullPath(outputFileName)) {
    outputFileName = cmSystemTools::CollapseFullPath(outputFileName);
  } else {
    outputFileName = this->FixRelativePath(outputFileName, PathForOutput, lg);
  }

  return outputFileName;
}